

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPub.c
# Opt level: O1

sbfPub sbfPub_create(sbfTport tport,sbfQueue queue,char *topic0,sbfPubReadyCb readyCb,void *closure)

{
  sbfLog psVar1;
  sbfTport tport_00;
  sbfTportStreamImpl **ppsVar2;
  sbfTopic psVar3;
  sbfPub psVar4;
  char *pcVar5;
  size_t sVar6;
  sbfTportHeaderImpl *psVar7;
  sbfTportStreamImpl *psVar8;
  sbfMwThread psVar9;
  sbfHandlerStream pvVar10;
  
  psVar4 = (sbfPub)0x0;
  psVar3 = sbfTopic_create(SBF_TOPIC_PUB,topic0);
  if (psVar3 != (sbfTopic)0x0) {
    psVar4 = (sbfPub)sbfMemory_calloc(1,0x168);
    psVar4->mTopic = psVar3;
    psVar4->mDestroyed = 0;
    psVar4->mRefCount = 1;
    psVar4->mReady = 0;
    psVar4->mTport = tport;
    psVar4->mTportStream = (sbfTportStreamImpl *)0x0;
    psVar4->mTportTopic = (sbfTportTopicImpl *)0x0;
    psVar1 = tport->mLog;
    pcVar5 = sbfTopic_getTopic(psVar3);
    sbfLog_log(psVar1,0,"creating publisher %p (%s)",psVar4,pcVar5);
    psVar4->mQueue = queue;
    psVar4->mReadyCb = readyCb;
    psVar4->mClosure = closure;
    pcVar5 = sbfTopic_getTopic(psVar4->mTopic);
    sVar6 = strlen(pcVar5);
    psVar4->mHeaderSize = (sVar6 + 6 & 0xfffffffffffffff8) + 8;
    psVar7 = (sbfTportHeaderImpl *)sbfMemory_calloc(1);
    psVar4->mHeader = psVar7;
    psVar7->mTopicSize = (char)psVar4->mHeaderSize + 0xfb;
    memcpy(psVar7 + 1,pcVar5,sVar6 + 1);
    tport_00 = psVar4->mTport;
    pthread_mutex_lock((pthread_mutex_t *)&tport_00->mStreamsLock);
    psVar8 = (sbfTportStreamImpl *)
             (*tport_00->mHandlerTable->mFindStream)(tport_00->mHandler,psVar4->mTopic);
    if (psVar8 == (sbfTportStreamImpl *)0x0) {
      psVar3 = psVar4->mTopic;
      psVar8 = (sbfTportStreamImpl *)sbfMemory_calloc(1,0x60);
      psVar8->mTport = tport_00;
      psVar9 = sbfTport_nextThread(tport_00);
      psVar8->mThread = psVar9;
      sbfLog_log(tport_00->mLog,0,"adding stream %p",psVar8);
      psVar8->mRefCount = 0;
      psVar8->mReady = 0;
      (psVar8->mTopics).rbh_root = (sbfTportTopicImpl *)0x0;
      sbfMutex_init(&psVar8->mSendLock,0);
      pvVar10 = (*tport_00->mHandlerTable->mAddStream)
                          (tport_00->mHandler,psVar3,psVar8->mThread,psVar8,
                           sbfPubAddStreamCompleteCb,psVar4);
      psVar8->mStream = pvVar10;
      (psVar8->mEntry).tqe_next = (sbfTportStreamImpl *)0x0;
      ppsVar2 = (tport_00->mStreams).tqh_last;
      (psVar8->mEntry).tqe_prev = ppsVar2;
      *ppsVar2 = psVar8;
      (tport_00->mStreams).tqh_last = &(psVar8->mEntry).tqe_next;
    }
    else {
      sbfMw_enqueueThread(psVar8->mThread,&psVar4->mEventAdd,sbfPubAddEventCb,psVar4);
    }
    psVar4->mTportStream = psVar8;
    LOCK();
    (psVar8->mRefCount).mRefCount = (psVar8->mRefCount).mRefCount + 1;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)&tport_00->mStreamsLock);
  }
  return psVar4;
}

Assistant:

sbfPub
sbfPub_create (sbfTport tport,
               sbfQueue queue,
               const char* topic0,
               sbfPubReadyCb readyCb,
               void* closure)
{
    sbfPub   pub;
    sbfTopic topic;

    topic = sbfTopic_create (SBF_TOPIC_PUB, topic0);
    if (topic == NULL)
        return NULL;

    pub = xcalloc (1, sizeof *pub);
    pub->mTopic = topic;

    pub->mDestroyed = 0;
    sbfRefCount_init (&pub->mRefCount, 1);

    pub->mReady = 0;

    pub->mTport = tport;
    pub->mTportStream = NULL;
    pub->mTportTopic = NULL;

    sbfLog_debug (tport->mLog,
                  "creating publisher %p (%s)",
                  pub,
                  sbfTopic_getTopic (pub->mTopic));

    pub->mQueue = queue;
    pub->mReadyCb = readyCb;
    pub->mClosure = closure;

    sbfPubMakeHeader (pub);
    sbfPubSetStream (pub);

    return pub;
}